

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Outlining.cpp
# Opt level: O0

Sequences * __thiscall
wasm::Outlining::makeSequences
          (Sequences *__return_storage_ptr__,Outlining *this,Module *module,Substrings *substrings,
          HashStringifyWalker *stringify)

{
  uint startIdx;
  uint uVar1;
  bool bVar2;
  reference substring_00;
  reference puVar3;
  type *ptVar4;
  const_reference ppEVar5;
  mapped_type *this_00;
  string_view sVar6;
  BasicType local_fc;
  string_view local_f8;
  undefined1 local_e0 [8];
  OutliningSequence seq;
  type *existingFunc;
  type *relativeIdx;
  uint32_t local_94;
  const_iterator cStack_90;
  uint seqIdx;
  const_iterator __end3;
  const_iterator __begin3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3;
  Name func;
  RepeatedSubstring *substring;
  const_iterator __end2;
  const_iterator __begin2;
  Substrings *__range2;
  HashStringifyWalker *stringify_local;
  Substrings *substrings_local;
  Module *module_local;
  Outlining *this_local;
  Sequences *seqByFunc;
  
  std::
  unordered_map<wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>_>_>
  ::unordered_map(__return_storage_ptr__);
  __end2 = std::
           vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
           ::begin(substrings);
  substring = (RepeatedSubstring *)
              std::
              vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
              ::end(substrings);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_wasm::SuffixTree::RepeatedSubstring_*,_std::vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>_>
                                *)&substring);
    if (!bVar2) break;
    substring_00 = __gnu_cxx::
                   __normal_iterator<const_wasm::SuffixTree::RepeatedSubstring_*,_std::vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>_>
                   ::operator*(&__end2);
    sVar6 = (string_view)addOutlinedFunction(this,module,substring_00,&stringify->exprs);
    __end3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                       (&substring_00->StartIndices);
    cStack_90 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                          (&substring_00->StartIndices);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffff70);
      if (!bVar2) break;
      puVar3 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end3);
      local_94 = *puVar3;
      HashStringifyWalker::makeRelative
                ((pair<unsigned_int,_wasm::Name> *)&relativeIdx,stringify,local_94);
      ptVar4 = std::get<0ul,unsigned_int,wasm::Name>((pair<unsigned_int,_wasm::Name> *)&relativeIdx)
      ;
      seq._24_8_ = std::get<1ul,unsigned_int,wasm::Name>
                             ((pair<unsigned_int,_wasm::Name> *)&relativeIdx);
      startIdx = *ptVar4;
      uVar1 = substring_00->Length;
      local_f8 = sVar6;
      ppEVar5 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                          (&stringify->exprs,(ulong)((local_94 - 1) + substring_00->Length));
      local_fc = unreachable;
      bVar2 = wasm::Type::operator==(&(*ppEVar5)->type,&local_fc);
      OutliningSequence::OutliningSequence
                ((OutliningSequence *)local_e0,startIdx,startIdx + uVar1,(Name)local_f8,bVar2);
      this_00 = std::
                unordered_map<wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>_>_>
                ::operator[](__return_storage_ptr__,(key_type *)seq._24_8_);
      std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>::push_back
                (this_00,(value_type *)local_e0);
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end3);
    }
    __gnu_cxx::
    __normal_iterator<const_wasm::SuffixTree::RepeatedSubstring_*,_std::vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

Sequences makeSequences(Module* module,
                          const Substrings& substrings,
                          const HashStringifyWalker& stringify) {
    Sequences seqByFunc;
    for (auto& substring : substrings) {
      auto func = addOutlinedFunction(module, substring, stringify.exprs);
      for (auto seqIdx : substring.StartIndices) {
        // seqIdx is relative to the entire program; making the idx of the
        // sequence relative to its function is better for outlining because we
        // walk functions.
        auto [relativeIdx, existingFunc] = stringify.makeRelative(seqIdx);
        auto seq = OutliningSequence(
          relativeIdx,
          relativeIdx + substring.Length,
          func,
          stringify.exprs[seqIdx + substring.Length - 1]->type ==
            Type::unreachable
#if OUTLINING_DEBUG
          ,
          seqIdx
#endif
        );
        seqByFunc[existingFunc].push_back(seq);
      }
    }
    return seqByFunc;
  }